

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O3

sexp_conflict
json_write_object(sexp_conflict ctx,sexp_conflict self,sexp_conflict obj,sexp_conflict out)

{
  sexp psVar1;
  sexp psVar2;
  sexp psVar3;
  long lVar4;
  sexp_conflict psVar5;
  char *msg;
  sexp psVar6;
  sexp_conflict tmp;
  sexp_conflict local_60;
  sexp_conflict local_58;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_58 = (sexp_conflict)&DAT_0000043e;
  lVar4 = sexp_length_op(ctx,0,1,obj);
  if (lVar4 == 0x3e) {
    sexp_json_write_exception(ctx,self,"unable to encode circular list",obj);
  }
  local_50.var = &local_58;
  local_40.next = &local_50;
  local_50.next = (ctx->value).context.saves;
  local_40.var = &local_60;
  (ctx->value).context.saves = &local_40;
  local_60 = (sexp_conflict)&DAT_0000043e;
  psVar6 = (out->value).type.setters;
  if (psVar6 == (sexp)0x0) {
    putc(0x7b,(FILE *)(out->value).type.getters);
  }
  else {
    psVar1 = (out->value).type.print;
    if (psVar1 < (sexp)(out->value).port.size) {
      (out->value).type.print = (sexp)((long)&psVar1->tag + 1);
      *(undefined1 *)((long)&psVar1->tag + (long)&psVar6->tag) = 0x7b;
    }
    else {
      sexp_buffered_write_char(ctx,0x7b,out);
    }
  }
  psVar6 = obj;
  psVar5 = local_60;
  if (((ulong)obj & 3) == 0) {
    while (psVar5 = local_60, psVar6->tag == 6) {
      if (psVar6 != obj) {
        psVar1 = (out->value).type.setters;
        if (psVar1 == (sexp)0x0) {
          putc(0x2c,(FILE *)(out->value).type.getters);
        }
        else {
          psVar2 = (out->value).type.print;
          if (psVar2 < (sexp)(out->value).port.size) {
            (out->value).type.print = (sexp)((long)&psVar2->tag + 1);
            *(undefined1 *)((long)&psVar2->tag + (long)&psVar1->tag) = 0x2c;
          }
          else {
            sexp_buffered_write_char(ctx,0x2c,out);
          }
        }
      }
      psVar1 = (psVar6->value).type.name;
      if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 6)) {
        msg = "unable to encode key-value pair: not a pair";
LAB_0010400d:
        psVar5 = sexp_json_write_exception(ctx,self,msg,obj);
        break;
      }
      psVar5 = (psVar1->value).type.name;
      if ((((uint)psVar5 & 0xf) != 6) && ((((ulong)psVar5 & 3) != 0 || (psVar5->tag != 7)))) {
        msg = "unable to encode key: not a symbol";
        obj = psVar5;
        goto LAB_0010400d;
      }
      local_58 = (sexp_conflict)sexp_symbol_to_string_op(ctx,0,1);
      local_58 = json_write(ctx,self,local_58,out);
      if ((((ulong)local_58 & 3) == 0) && (psVar5 = local_58, local_58->tag == 0x13)) break;
      psVar2 = (out->value).type.setters;
      if (psVar2 == (sexp)0x0) {
        putc(0x3a,(FILE *)(out->value).type.getters);
      }
      else {
        psVar3 = (out->value).type.print;
        if (psVar3 < (sexp)(out->value).port.size) {
          (out->value).type.print = (sexp)((long)&psVar3->tag + 1);
          *(undefined1 *)((long)&psVar3->tag + (long)&psVar2->tag) = 0x3a;
        }
        else {
          sexp_buffered_write_char(ctx,0x3a,out);
        }
      }
      local_58 = json_write(ctx,self,(psVar1->value).type.cpl,out);
      if (((((ulong)local_58 & 3) == 0) && (psVar5 = local_58, local_58->tag == 0x13)) ||
         (psVar6 = (psVar6->value).type.cpl, psVar5 = local_60, ((ulong)psVar6 & 3) != 0)) break;
    }
  }
  local_60 = psVar5;
  psVar6 = (out->value).type.setters;
  if (psVar6 == (sexp)0x0) {
    putc(0x7d,(FILE *)(out->value).type.getters);
  }
  else {
    psVar1 = (out->value).type.print;
    if (psVar1 < (sexp)(out->value).port.size) {
      (out->value).type.print = (sexp)((long)&psVar1->tag + 1);
      *(undefined1 *)((long)&psVar1->tag + (long)&psVar6->tag) = 0x7d;
    }
    else {
      sexp_buffered_write_char(ctx,0x7d,out);
    }
  }
  (ctx->value).context.saves = local_50.next;
  return local_60;
}

Assistant:

sexp json_write_object(sexp ctx, sexp self, const sexp obj, sexp out) {
  sexp ls, cur, key, val;
  sexp_gc_var2(tmp, res);
  if (sexp_length(ctx, obj) == SEXP_FALSE)
     sexp_json_write_exception(ctx, self, "unable to encode circular list", obj);
  sexp_gc_preserve2(ctx, tmp, res);
  res = SEXP_VOID;
  sexp_write_char(ctx, '{', out);
  for (ls = obj; sexp_pairp(ls); ls = sexp_cdr(ls)) {
    if (ls != obj)
      sexp_write_char(ctx, ',', out);
    cur = sexp_car(ls);
    if (!sexp_pairp(cur)) {
      res = sexp_json_write_exception(ctx, self, "unable to encode key-value pair: not a pair", obj);
      break;
    }
    key = sexp_car(cur);
    if (!sexp_symbolp(key)) {
      res = sexp_json_write_exception(ctx, self, "unable to encode key: not a symbol", key);
      break;
    }
    tmp = sexp_symbol_to_string(ctx, key);
    tmp = json_write(ctx, self, tmp, out);
    if (sexp_exceptionp(tmp)) {
      res = tmp;
      break;
    }
    sexp_write_char(ctx, ':', out);
    val = sexp_cdr(cur);
    tmp = json_write(ctx, self, val, out);
    if (sexp_exceptionp(tmp)) {
      res = tmp;
      break;
    }
  }
  sexp_write_char(ctx, '}', out);
  sexp_gc_release2(ctx);
  return res;
}